

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_sum_rows(ggml_context *ctx,ggml_tensor *a)

{
  ggml_tensor *pgVar1;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  int i;
  int64_t ne [4];
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar2;
  int64_t local_38 [5];
  ggml_tensor *local_10;
  
  local_38[0] = 1;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  for (iVar2 = 1; iVar2 < 4; iVar2 = iVar2 + 1) {
    local_38[iVar2] = in_RSI->ne[iVar2];
  }
  local_10 = in_RSI;
  pgVar1 = ggml_new_tensor((ggml_context *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                           (ggml_type)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                           (int)in_stack_ffffffffffffffb8,(int64_t *)0x14bc3e);
  pgVar1->op = GGML_OP_SUM_ROWS;
  pgVar1->src[0] = local_10;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_sum_rows(
        struct ggml_context * ctx,
        struct ggml_tensor  * a) {
    int64_t ne[GGML_MAX_DIMS] = { 1 };
    for (int i = 1; i < GGML_MAX_DIMS; ++i) {
        ne[i] = a->ne[i];
    }

    struct ggml_tensor * result = ggml_new_tensor(ctx, a->type, GGML_MAX_DIMS, ne);

    result->op     = GGML_OP_SUM_ROWS;
    result->src[0] = a;

    return result;
}